

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

Token * __thiscall Parser::peekToken(Parser *this,int delta)

{
  pointer pTVar1;
  undefined8 extraout_RAX;
  ulong uVar2;
  ulong uVar3;
  Parser *this_00;
  undefined1 local_30 [32];
  
  uVar2 = (long)delta + (long)this->mTokenIndex;
  pTVar1 = (this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pTVar1 >> 4) * -0x3333333333333333;
  if (uVar2 <= uVar3 && uVar3 - uVar2 != 0) {
    return pTVar1 + uVar2;
  }
  this_00 = (Parser *)local_30;
  local_30._0_8_ = (CalculationEngine *)(local_30 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"Reached end of tokens.","");
  parseError(this_00,(string *)local_30);
  if ((CalculationEngine *)local_30._0_8_ != (CalculationEngine *)(local_30 + 0x10)) {
    operator_delete((void *)local_30._0_8_,(ulong)(local_30._16_8_ + 1));
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token& Parser::peekToken(int delta) {
	int nextTokenIndex = mTokenIndex + delta;

	if ((std::size_t)nextTokenIndex >= mTokens.size()) {
		parseError("Reached end of tokens.");
	}

	return mTokens[nextTokenIndex];
}